

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  ARKTimestepDisableLSetup in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x3f6,"ARKodeSetLinSysFn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x3ff,"ARKodeSetLinSysFn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffd8,
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               ,in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      if ((in_RSI == (ARKTimestepDisableLSetup)0x0) || (in_stack_ffffffffffffffd8->SRabstol != 0.0))
      {
        if (in_RSI == (ARKTimestepDisableLSetup)0x0) {
          *(undefined4 *)&in_stack_ffffffffffffffd8->step_attachlinsol = 0;
          in_stack_ffffffffffffffd8->step_disablelsetup = arkLsLinSys;
          in_stack_ffffffffffffffd8->step_getlinmem = (ARKTimestepGetLinMemFn)in_RDI;
        }
        else {
          *(undefined4 *)&in_stack_ffffffffffffffd8->step_attachlinsol = 1;
          in_stack_ffffffffffffffd8->step_disablelsetup = in_RSI;
          in_stack_ffffffffffffffd8->step_getlinmem = (ARKTimestepGetLinMemFn)in_RDI->user_data;
        }
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-3,0x40b,"ARKodeSetLinSysFn",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                        ,"Linear system setup routine cannot be supplied for NULL SUNMatrix");
        local_4 = -3;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetLinSysFn(void* arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return (ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL)
  {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  }
  else
  {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return (ARKLS_SUCCESS);
}